

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O3

void __thiscall AGSSockAPI::Beacon::Beacon(Beacon *this)

{
  int iVar1;
  uint uVar2;
  
  pipe((int *)this);
  iVar1 = (this->data).fd[0];
  uVar2 = fcntl(iVar1,3,0);
  fcntl(iVar1,4,(ulong)(uVar2 | 0x800));
  iVar1 = (this->data).fd[1];
  uVar2 = fcntl(iVar1,3,0);
  fcntl(iVar1,4,(ulong)(uVar2 | 0x800));
  return;
}

Assistant:

Beacon::Beacon()
{
#if defined(_WIN32) && (IMPL_MODE == 1)
	data.fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	setblocking(data.fd, false);
	
	sockaddr_in addr;
	addr.sin_family = AF_INET;
	addr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	addr.sin_port = 0;
	
	connect(data.fd, reinterpret_cast<sockaddr *> (&addr), sizeof (addr));
#elif defined(_WIN32) && (IMPL_MODE == 2)
	data.fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	setblocking(data.fd, false);
#else
	pipe(data.fd);
	setblocking(data.fd[0], false);
	setblocking(data.fd[1], false);
#endif
}